

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void TableBgColor(TidyDocImpl *doc,Node *node)

{
  AttVal *attr_00;
  tmbchar local_128 [8];
  tmbchar buf [256];
  AttVal *attr;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  attr_00 = prvTidyAttrGetById(node,TidyAttr_BGCOLOR);
  if (attr_00 != (AttVal *)0x0) {
    prvTidytmbsnprintf(local_128,0x100,"background-color: %s",attr_00->value);
    prvTidyRemoveAttribute(doc,node,attr_00);
    prvTidyAddStyleProperty(doc,node,local_128);
  }
  return;
}

Assistant:

static void TableBgColor( TidyDocImpl* doc, Node* node )
{
    AttVal* attr;
    tmbchar buf[256];

    if (NULL != (attr = TY_(AttrGetById)(node, TidyAttr_BGCOLOR)))
    {
        TY_(tmbsnprintf)(buf, sizeof(buf), "background-color: %s", attr->value );
        TY_(RemoveAttribute)( doc, node, attr );
        TY_(AddStyleProperty)( doc, node, buf );
    }
}